

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  undefined1 auStack_b8 [7];
  _Bool isMutable;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_64_8_77d55576 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.value = (sysbvm_tuple_t)(arguments + 1);
  memset(&gcFrameRecord.roots,0,0x40);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  _auStack_b8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken
                    (context,*(sysbvm_tuple_t *)gcFrame.value);
  gcFrameRecord.roots[3] = sVar3;
  gcFrame.variableDefinitionNode =
       (sysbvm_astVariableDefinitionNode_t *)
       sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                 (context,gcFrameRecord.roots[5],(context->roots).symbolType,
                  *(sysbvm_tuple_t *)gcFrame.value);
  gcFrameRecord.roots[5] = (sysbvm_tuple_t)gcFrame.variableDefinitionNode;
  _Var1 = sysbvm_tuple_boolean_decode(gcFrameRecord.roots[9]);
  if (_Var1) {
    sysbvm_environment_setNewMacroValueBinding
              (context,*(sysbvm_tuple_t *)gcFrame.value,gcFrameRecord.roots[2],gcFrame.localBinding,
               gcFrameRecord.roots[7]);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local =
         (sysbvm_context_t *)sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],0x2f);
  }
  else {
    if (gcFrameRecord.roots[6] != 0) {
      gcFrame.analyzedNameExpression =
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                     (context,gcFrameRecord.roots[6],(context->roots).typeType,
                      *(sysbvm_tuple_t *)gcFrame.value);
      _Var1 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedNameExpression);
      if (_Var1) {
        gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
      }
    }
    gcFrame.analyzedTypeExpression =
         sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
                   (context,gcFrameRecord.roots[7],gcFrame.analyzedNameExpression,
                    *(sysbvm_tuple_t *)gcFrame.value,gcFrameRecord.roots[2],&gcFrame.name);
    gcFrameRecord.roots[7] = gcFrame.analyzedTypeExpression;
    if ((gcFrame.name == 0) && (gcFrameRecord.roots[6] == 0)) {
      gcFrame.name = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTypeExpression);
    }
    gcFrameRecord.roots[0xe] = gcFrame.name;
    _Var1 = sysbvm_tuple_boolean_decode(gcFrameRecord.roots[10]);
    if (_Var1) {
      gcFrame.name = sysbvm_type_createMemberReferenceType(context,gcFrame.name);
    }
    gcFrameRecord.roots[6] = 0;
    gcFrameRecord.roots[4] = gcFrame.name;
    if (gcFrame.variableDefinitionNode == (sysbvm_astVariableDefinitionNode_t *)0x0) {
      if (gcFrame.analyzedTypeExpression == 0) {
        gcFrame.analyzedTypeExpression =
             sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],0);
      }
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      context_local = (sysbvm_context_t *)gcFrame.analyzedTypeExpression;
    }
    else {
      _Var2 = sysbvm_astNode_isLiteralNode(context,(sysbvm_tuple_t)gcFrame.variableDefinitionNode);
      if (!_Var2) {
        sysbvm_error("Local definition analyzed name must be a literal node.");
      }
      gcFrame.localBinding =
           sysbvm_astLiteralNode_getValue((sysbvm_tuple_t)gcFrame.variableDefinitionNode);
      if ((_Var1) ||
         ((gcFrame.analyzedTypeExpression != 0 &&
          (_Var1 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedTypeExpression), !_Var1))))
      {
        gcFrame.analyzedValueExpression =
             sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                       (context,*(sysbvm_tuple_t *)gcFrame.value,gcFrameRecord.roots[2],
                        gcFrame.localBinding,gcFrame.name);
        gcFrameRecord.roots[8] = gcFrame.analyzedValueExpression;
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        context_local = (sysbvm_context_t *)gcFrameRecord.roots;
      }
      else {
        if (gcFrame.analyzedTypeExpression != 0) {
          gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);
        }
        gcFrame.analyzedTypeExpression =
             sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],gcFrame.type);
        gcFrame.analyzedValueExpression =
             sysbvm_analysisEnvironment_setNewValueBinding
                       (context,*(sysbvm_tuple_t *)gcFrame.value,gcFrameRecord.roots[2],
                        gcFrame.localBinding,gcFrame.type);
        gcFrameRecord.roots[8] = gcFrame.analyzedValueExpression;
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        context_local = (sysbvm_context_t *)gcFrame.analyzedTypeExpression;
      }
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astVariableDefinitionNode_t *variableDefinitionNode;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTypeExpression;
        sysbvm_tuple_t analyzedValueExpression;
        
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t name;
        sysbvm_tuple_t type;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t*)sysbvm_context_shallowCopy(context, *node);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.variableDefinitionNode->super.sourcePosition);
    gcFrame.variableDefinitionNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variableDefinitionNode->nameExpression, context->roots.symbolType, *environment);
    gcFrame.variableDefinitionNode->nameExpression = gcFrame.analyzedNameExpression;

    if(sysbvm_tuple_boolean_decode(gcFrame.variableDefinitionNode->isMacroSymbol))
    {
        sysbvm_environment_setNewMacroValueBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.variableDefinitionNode->valueExpression);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
    }

    if(gcFrame.variableDefinitionNode->typeExpression)
    {
        gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variableDefinitionNode->typeExpression, context->roots.typeType, *environment);

        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
            gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);
    }

    gcFrame.analyzedValueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(context, gcFrame.variableDefinitionNode->valueExpression, gcFrame.analyzedTypeExpression, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, &gcFrame.type);
    gcFrame.variableDefinitionNode->valueExpression = gcFrame.analyzedValueExpression;

    // Fallback to the type of the analyzed value.
    if(!gcFrame.type && !gcFrame.variableDefinitionNode->typeExpression)
        gcFrame.type = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedValueExpression);
    gcFrame.variableDefinitionNode->analyzedValueType = gcFrame.type;

    bool isMutable = sysbvm_tuple_boolean_decode(gcFrame.variableDefinitionNode->isMutable);
    if(isMutable)
        gcFrame.type = sysbvm_type_createMemberReferenceType(context, gcFrame.type);

    gcFrame.variableDefinitionNode->typeExpression = SYSBVM_NULL_TUPLE;
    gcFrame.variableDefinitionNode->super.analyzedType = gcFrame.type;
    if(!gcFrame.analyzedNameExpression)
    {
        if(!gcFrame.analyzedValueExpression)
            gcFrame.analyzedValueExpression = sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, SYSBVM_NULL_TUPLE);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedValueExpression;
    }

    if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
        sysbvm_error("Local definition analyzed name must be a literal node.");

    gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    if(!isMutable &&
        (!gcFrame.analyzedValueExpression || sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedValueExpression)))
    {
        if(gcFrame.analyzedValueExpression)
            gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedValueExpression);
        gcFrame.analyzedValueExpression = sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.value);
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.value);
        gcFrame.variableDefinitionNode->binding = gcFrame.localBinding;

        // Replace the node by its literal value.
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedValueExpression;
    }
    else
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.type);
        gcFrame.variableDefinitionNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.variableDefinitionNode;
}